

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O3

unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_> __thiscall
verilogAST::AssignMapBuilder::visit
          (AssignMapBuilder *this,
          unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_> *node)

{
  long lVar1;
  long *in_RDX;
  string port_str;
  anon_class_1_0_00000001 local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/assign_inliner.cpp:107:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
    ::_S_vtable._M_arr[*(byte *)(*in_RDX + 0x10)]._M_data)
            (&local_38,&local_39,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
              *)(*in_RDX + 8));
  if (*(int *)(*in_RDX + 0x18) == 0) {
    lVar1 = 0x28;
  }
  else {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)node[3]._M_t.
                  super___uniq_ptr_impl<verilogAST::Port,_std::default_delete<verilogAST::Port>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_verilogAST::Port_*,_std::default_delete<verilogAST::Port>_>
                  .super__Head_base<0UL,_verilogAST::Port_*,_false>._M_head_impl,&local_38);
    lVar1 = 0x20;
    if (*(int *)(*in_RDX + 0x18) != 1) goto LAB_0015e5ef;
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            (*(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               **)((long)&(node->_M_t).
                          super___uniq_ptr_impl<verilogAST::Port,_std::default_delete<verilogAST::Port>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_verilogAST::Port_*,_std::default_delete<verilogAST::Port>_>
                          .super__Head_base<0UL,_verilogAST::Port_*,_false>._M_head_impl + lVar1),
             &local_38);
LAB_0015e5ef:
  (this->super_Transformer)._vptr_Transformer = (_func_int **)*in_RDX;
  *in_RDX = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<verilogAST::Port,_std::default_delete<verilogAST::Port>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Port,_std::default_delete<verilogAST::Port>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Port> AssignMapBuilder::visit(std::unique_ptr<Port> node) {
  std::string port_str = std::visit(
      [](auto&& value) -> std::string {
        if (auto ptr = dynamic_cast<Identifier*>(value.get())) {
          return ptr->toString();
        } else if (auto ptr = dynamic_cast<Vector*>(value.get())) {
          return ptr->id->toString();
        }
        throw std::runtime_error("Unreachable");  // LCOV_EXCL_LINE
        return "";                                // LCOV_EXCL_LINE
      },
      node->value);
  if (node->direction != Direction::INPUT) {
    this->non_input_ports.insert(port_str);
    if (node->direction == Direction::OUTPUT) {
      this->output_ports.insert(port_str);
    }
  } else {
    this->input_ports.insert(port_str);
  }
  return node;
}